

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<10,_0,_9,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int in_ECX;
  Matrix<float,_3,_3> *mat;
  VecAccess<float,_4,_3> local_c8;
  Mat3 local_b0;
  Matrix<float,_3,_3> local_8c;
  Vector<float,_3> local_68 [2];
  Mat3 local_4c;
  Vector<float,_3> local_28;
  Vector<float,_3> local_1c;
  ShaderEvalContext *local_10;
  ShaderEvalContext *evalCtx_local;
  
  local_10 = evalCtx;
  getInputValue<0,9>(&local_4c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_28,&local_4c);
  getInputValue<0,9>(&local_b0,(MatrixCaseUtils *)local_10,(ShaderEvalContext *)0x0,in_ECX);
  decrement<float,3,3>(&local_8c,(MatrixCaseUtils *)&local_b0,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_68,&local_8c);
  tcu::operator+((tcu *)&local_1c,&local_28,local_68);
  tcu::Vector<float,_4>::xyz(&local_c8,&local_10->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_c8,&local_1c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_8c);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_b0);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_4c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(decrement(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}